

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warning.cpp
# Opt level: O0

void processWarningFlag(char *flag)

{
  char *__s1;
  bool bVar1;
  int iVar2;
  WarningID WVar3;
  char *pcVar4;
  WarningState local_b4;
  WarningState local_94;
  EnumSeqIterator<WarningID> local_88;
  WarningID id_1;
  EnumSeqIterator<WarningID> __end1_1;
  EnumSeqIterator<WarningID> __begin1_1;
  EnumSeq<WarningID> *__range1_1;
  char *pcStack_68;
  bool warned;
  char *ptr_1;
  uint8_t param;
  char *equals;
  char *rootFlag;
  WarningState state;
  char *errorFlag;
  uint8_t *ptr;
  EnumSeqIterator<WarningID> local_28;
  WarningID id;
  EnumSeqIterator<WarningID> __end1;
  EnumSeqIterator<WarningID> __begin1;
  EnumSeq<WarningID> *__range1;
  char *flag_local;
  
  EnumSeq<WarningID>::EnumSeq((EnumSeq<WarningID> *)&__end1,NB_PLAIN_AND_PARAM_WARNINGS,NB_WARNINGS)
  ;
  id = (WarningID)EnumSeq<WarningID>::begin((EnumSeq<WarningID> *)&__end1);
  local_28 = EnumSeq<WarningID>::end((EnumSeq<WarningID> *)&__end1);
  while (bVar1 = operator!=((EnumSeqIterator<WarningID> *)&id,&local_28), bVar1) {
    WVar3 = EnumSeqIterator<WarningID>::operator*((EnumSeqIterator<WarningID> *)&id);
    iVar2 = strcmp(flag,warningFlags[WVar3]);
    if (iVar2 == 0) {
      if ((processWarningFlag::setError & 1U) == 0) {
        for (errorFlag = (char *)metaWarningCommands[(int)(WVar3 - NB_PLAIN_AND_PARAM_WARNINGS)];
            *errorFlag != '\x19'; errorFlag = errorFlag + 1) {
          if (warningStates[(byte)*errorFlag] == WARNING_DEFAULT) {
            warningStates[(byte)*errorFlag] = WARNING_ENABLED;
          }
        }
        return;
      }
      errx("Cannot make meta warning \"%s\" into an error",flag);
    }
    EnumSeqIterator<WarningID>::operator++((EnumSeqIterator<WarningID> *)&id);
  }
  iVar2 = strncmp(flag,"error",5);
  if (iVar2 == 0) {
    if (flag[5] == '\0') {
      warningsAreErrors = true;
      return;
    }
    if (flag[5] == '=') {
      processWarningFlag::setError = true;
      processWarningFlag(flag + 6);
      processWarningFlag::setError = false;
      return;
    }
  }
  if ((processWarningFlag::setError & 1U) == 0) {
    iVar2 = strncmp(flag,"no-",3);
    local_94 = WARNING_DISABLED;
    if (iVar2 != 0) {
      local_94 = WARNING_ENABLED;
    }
  }
  else {
    local_94 = WARNING_ERROR;
  }
  if (local_94 == WARNING_DISABLED) {
    __s1 = flag + 3;
  }
  else {
    pcVar4 = strchr(flag,0x3d);
    __s1 = flag;
    if ((pcVar4 != (char *)0x0) && (pcVar4[1] != '\0')) {
      ptr_1._7_1_ = 0;
      pcStack_68 = pcVar4 + 1;
      bVar1 = false;
      do {
        if ((*pcStack_68 < '0') || ('9' < *pcStack_68)) break;
        if (0xff - (*pcStack_68 + -0x30) < (int)(uint)ptr_1._7_1_) {
          if (!bVar1) {
            warnx("Invalid warning flag \"%s\": capping parameter at 255\n",flag);
          }
          bVar1 = true;
          ptr_1._7_1_ = 0xff;
        }
        else {
          ptr_1._7_1_ = ptr_1._7_1_ * '\n' + *pcStack_68 + -0x30;
          pcStack_68 = pcStack_68 + 1;
        }
      } while (*pcStack_68 != '\0');
      if (*pcStack_68 == '\0') {
        if (((processWarningFlag::setError & 1U) != 0) && (ptr_1._7_1_ == 0)) {
          warnx("Ignoring nonsensical warning flag \"%s\"\n",flag);
          return;
        }
        *pcVar4 = '\0';
        if (ptr_1._7_1_ == 0) {
          local_b4 = WARNING_DISABLED;
        }
        else {
          local_b4 = local_94;
        }
        bVar1 = tryProcessParamWarning(flag,ptr_1._7_1_,local_b4);
        if (bVar1) {
          return;
        }
      }
    }
  }
  EnumSeq<WarningID>::EnumSeq((EnumSeq<WarningID> *)&__end1_1,NB_PLAIN_WARNINGS);
  id_1 = (WarningID)EnumSeq<WarningID>::begin((EnumSeq<WarningID> *)&__end1_1);
  local_88 = EnumSeq<WarningID>::end((EnumSeq<WarningID> *)&__end1_1);
  while( true ) {
    bVar1 = operator!=((EnumSeqIterator<WarningID> *)&id_1,&local_88);
    if (!bVar1) {
      bVar1 = tryProcessParamWarning(__s1,'\0',local_94);
      if (!bVar1) {
        warnx("Unknown warning `%s`",flag);
      }
      return;
    }
    WVar3 = EnumSeqIterator<WarningID>::operator*((EnumSeqIterator<WarningID> *)&id_1);
    iVar2 = strcmp(__s1,warningFlags[WVar3]);
    if (iVar2 == 0) break;
    EnumSeqIterator<WarningID>::operator++((EnumSeqIterator<WarningID> *)&id_1);
  }
  warningStates[WVar3] = local_94;
  return;
}

Assistant:

void processWarningFlag(char *flag)
{
	static bool setError = false;

	// First, try to match against a "meta" warning
	for (enum WarningID id : EnumSeq(META_WARNINGS_START, NB_WARNINGS)) {
		// TODO: improve the matching performance?
		if (!strcmp(flag, warningFlags[id])) {
			// We got a match!
			if (setError)
				errx("Cannot make meta warning \"%s\" into an error",
				     flag);

			for (uint8_t const *ptr = metaWarningCommands[id - META_WARNINGS_START];
			     *ptr != META_WARNING_DONE; ptr++) {
				// Warning flag, set without override
				if (warningStates[*ptr] == WARNING_DEFAULT)
					warningStates[*ptr] = WARNING_ENABLED;
			}

			return;
		}
	}

	// If it's not a meta warning, specially check against `-Werror`
	if (!strncmp(flag, "error", strlen("error"))) {
		char *errorFlag = flag + strlen("error");

		switch (*errorFlag) {
		case '\0':
			// `-Werror`
			warningsAreErrors = true;
			return;

		case '=':
			// `-Werror=XXX`
			setError = true;
			processWarningFlag(errorFlag + 1); // Skip the `=`
			setError = false;
			return;

		// Otherwise, allow parsing as another flag
		}
	}

	// Well, it's either a normal warning or a mistake

	enum WarningState state = setError ? WARNING_ERROR :
				  // Not an error, then check if this is a negation
				  strncmp(flag, "no-", strlen("no-")) ? WARNING_ENABLED
								      : WARNING_DISABLED;
	char *rootFlag = state == WARNING_DISABLED ? flag + strlen("no-") : flag;

	// Is this a "parametric" warning?
	if (state != WARNING_DISABLED) { // The `no-` form cannot be parametrized
		// First, check if there is an "equals" sign followed by a decimal number
		char *equals = strchr(rootFlag, '=');

		if (equals && equals[1] != '\0') { // Ignore an equal sign at the very end as well
			// Is the rest of the string a decimal number?
			// We want to avoid `strtoul`'s whitespace and sign, so we parse manually
			uint8_t param = 0;
			char const *ptr = equals + 1;
			bool warned = false;

			// The `if`'s condition above ensures that this will run at least once
			do {
				// If we don't have a digit, bail
				if (*ptr < '0' || *ptr > '9')
					break;
				// Avoid overflowing!
				if (param > UINT8_MAX - (*ptr - '0')) {
					if (!warned)
						warnx("Invalid warning flag \"%s\": capping parameter at 255\n",
						      flag);
					warned = true; // Only warn once, cap always
					param = 255;
					continue;
				}
				param = param * 10 + (*ptr - '0');

				ptr++;
			} while (*ptr);

			// If we managed to the end of the string, check that the warning indeed
			// accepts a parameter
			if (*ptr == '\0') {
				if (setError && param == 0) {
					warnx("Ignoring nonsensical warning flag \"%s\"\n", flag);
					return;
				}
				*equals = '\0'; // Truncate the param at the '='
				if (tryProcessParamWarning(rootFlag, param,
							   param == 0 ? WARNING_DISABLED : state))
					return;
			}
		}
	}

	// Try to match the flag against a "normal" flag
	for (enum WarningID id : EnumSeq(NB_PLAIN_WARNINGS)) {
		if (!strcmp(rootFlag, warningFlags[id])) {
			// We got a match!
			warningStates[id] = state;
			return;
		}
	}

	// Lastly, this might be a "parametric" warning without an equals sign
	// If it is, treat the param as 1 if enabling, or 0 if disabling
	if (tryProcessParamWarning(rootFlag, 0, state))
		return;

	warnx("Unknown warning `%s`", flag);
}